

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

Aig_Man_t * Saig_ManWindowExtractNodes(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  void **ppvVar1;
  void *pvVar2;
  int *piVar3;
  uint uVar4;
  Aig_Man_t *p_00;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  ulong uVar9;
  Aig_Obj_t *p1;
  int iVar10;
  long lVar11;
  
  Aig_ManCleanData(p);
  p_00 = Aig_ManStart(vNodes->nSize);
  pcVar5 = (char *)malloc(4);
  builtin_strncpy(pcVar5,"wnd",4);
  p_00->pName = pcVar5;
  p_00->pSpec = (char *)0x0;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar6 = Saig_ManWindowCollectPis(p,vNodes);
  iVar10 = pVVar6->nSize;
  if (0 < (long)iVar10) {
    ppvVar1 = pVVar6->pArray;
    lVar11 = 0;
    do {
      pvVar2 = ppvVar1[lVar11];
      pAVar7 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      lVar11 = lVar11 + 1;
    } while (iVar10 != lVar11);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  if (0 < vNodes->nSize) {
    lVar11 = 0;
    do {
      piVar3 = (int *)vNodes->pArray[lVar11];
      if (((piVar3[6] & 7U) == 2) && (p->nTruePis <= *piVar3)) {
        pAVar7 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)(piVar3 + 10) = pAVar7;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar11 = 0;
    do {
      pvVar2 = vNodes->pArray[lVar11];
      if (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006f2c9a;
        uVar8 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar7 = Aig_And(p_00,pAVar7,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar7;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  pVVar6 = Saig_ManWindowCollectPos(p,vNodes,(Vec_Ptr_t **)0x0);
  iVar10 = pVVar6->nSize;
  if (0 < (long)iVar10) {
    ppvVar1 = pVVar6->pArray;
    lVar11 = 0;
    do {
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)ppvVar1[lVar11] + 0x28));
      lVar11 = lVar11 + 1;
    } while (iVar10 != lVar11);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  if (vNodes->nSize < 1) {
    iVar10 = 0;
  }
  else {
    lVar11 = 0;
    iVar10 = 0;
    do {
      piVar3 = (int *)vNodes->pArray[lVar11];
      if ((((uint)*(undefined8 *)(piVar3 + 6) & 7) == 2) && (p->nTruePis <= *piVar3)) {
        if (*piVar3 < p->nTruePis) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar4 = (*piVar3 - p->nTruePis) + p->nTruePos;
        if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = p->vCos->pArray[uVar4];
        if (((ulong)pvVar2 & 1) != 0) {
LAB_006f2c9a:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar8 = *(ulong *)((long)pvVar2 + 8);
        uVar9 = uVar8 & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        Aig_ObjCreateCo(p_00,pAVar7);
        iVar10 = iVar10 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  Aig_ManSetRegNum(p_00,iVar10);
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractNodes( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pMatch;
    Vec_Ptr_t * vNodesPi, * vNodesPo;
    int i, nRegCount;
    Aig_ManCleanData( p ); 
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj = Aig_ManConst1( p );
    pObj->pData = Aig_ManConst1( pNew );
    // create real PIs
    vNodesPi = Saig_ManWindowCollectPis( p, vNodes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPi, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrFree( vNodesPi );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    // create POs
    vNodesPo = Saig_ManWindowCollectPos( p, vNodes, NULL );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodesPo, pObj, i )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Vec_PtrFree( vNodesPo );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p, pObj );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    return pNew;
}